

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O2

Promise<int> __thiscall kj::UnixEventPort::onChildExit(UnixEventPort *this,Maybe<int> *pid)

{
  Maybe<int> *in_RDX;
  NullableValue<int> adapterConstructorParams;
  Promise<int> PVar1;
  Own<kj::UnixEventPort::ChildSet> newChildSet;
  Fault local_48;
  NullableValue<int> local_40;
  Own<kj::UnixEventPort::ChildSet> local_38;
  
  if ((anonymous_namespace)::capturedChildExit == '\0') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[66]>
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xa6,FAILED,"capturedChildExit",
               "\"must call UnixEventPort::captureChildExit() to use onChildExit().\"",
               (char (*) [66])"must call UnixEventPort::captureChildExit() to use onChildExit().");
    kj::_::Debug::Fault::fatal(&local_48);
  }
  adapterConstructorParams = pid[0x1b].ptr;
  if (adapterConstructorParams == (NullableValue<int>)0x0) {
    if ((anonymous_namespace)::threadClaimedChildExits == '\x01') {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[62]>
                (&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
                 ,0xaf,FAILED,"!threadClaimedChildExits",
                 "\"only one UnixEvertPort per process may listen for child exits\"",
                 (char (*) [62])"only one UnixEvertPort per process may listen for child exits");
      kj::_::Debug::Fault::fatal(&local_48);
    }
    (anonymous_namespace)::threadClaimedChildExits = '\x01';
    heap<kj::UnixEventPort::ChildSet>();
    adapterConstructorParams = local_40;
    local_38.disposer = (Disposer *)local_48.exception;
    local_38.ptr = (ChildSet *)local_40;
    local_40.isSet = false;
    local_40._1_3_ = 0;
    local_40.field_1 = (anon_union_4_1_a8c68091_for_NullableValue<int>_2)0x0;
    Own<kj::UnixEventPort::ChildSet>::operator=
              ((Own<kj::UnixEventPort::ChildSet> *)(pid + 0x1a),&local_38);
    if ((NullableValue<int>)local_38.ptr != (NullableValue<int>)0x0) {
      local_38.ptr = (ChildSet *)0x0;
      (**(_func_int **)(((String *)&(local_38.disposer)->_vptr_Disposer)->content).ptr)();
    }
    if (local_40 != (NullableValue<int>)0x0) {
      local_40.isSet = false;
      local_40._1_3_ = 0;
      local_40.field_1 = (anon_union_4_1_a8c68091_for_NullableValue<int>_2)0x0;
      (**(_func_int **)((local_48.exception)->ownFile).content.ptr)();
    }
  }
  PVar1 = newAdaptedPromise<int,kj::UnixEventPort::ChildExitPromiseAdapter,kj::UnixEventPort::ChildSet&,kj::Maybe<int>&>
                    ((kj *)this,(ChildSet *)adapterConstructorParams,in_RDX);
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<int>)PVar1.super_PromiseBase.node;
}

Assistant:

Promise<int> UnixEventPort::onChildExit(Maybe<pid_t>& pid) {
  KJ_REQUIRE(capturedChildExit,
      "must call UnixEventPort::captureChildExit() to use onChildExit().");

  ChildSet* cs;
  KJ_IF_MAYBE(c, childSet) {
    cs = *c;
  } else {
    // In theory we should do an atomic compare-and-swap on threadClaimedChildExits, but this is
    // for debug purposes only so it's not a big deal.
    KJ_REQUIRE(!threadClaimedChildExits,
        "only one UnixEvertPort per process may listen for child exits");
    threadClaimedChildExits = true;

    auto newChildSet = kj::heap<ChildSet>();
    cs = newChildSet;
    childSet = kj::mv(newChildSet);
  }